

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void noise_suppression(char *in_file,char *out_file)

{
  uint64_t totalSampleCount;
  int16_t *buffer;
  double dVar1;
  double dVar2;
  uint32_t channels;
  uint32_t sampleRate;
  uint64_t inSampleCount;
  
  sampleRate = 0;
  channels = 0;
  inSampleCount = 0;
  buffer = wavRead_int16(in_file,&sampleRate,&inSampleCount,&channels);
  dVar1 = now();
  totalSampleCount = inSampleCount;
  nsProcess(buffer,sampleRate,inSampleCount,channels,kModerate);
  dVar2 = now();
  printf("time interval: %d ms\n ",(ulong)(uint)(int)((dVar2 - dVar1) * 1000.0));
  wavWrite_int16(out_file,buffer,sampleRate,totalSampleCount,channels);
  free(buffer);
  return;
}

Assistant:

void noise_suppression(char *in_file, char *out_file) {
    //音频采样率
    uint32_t sampleRate = 0;
    uint32_t channels = 0;
    //总音频采样数
    uint64_t inSampleCount = 0;
    int16_t *inBuffer = wavRead_int16(in_file, &sampleRate, &inSampleCount, &channels);

    //如果加载成功
    if (inBuffer != nullptr) {
        double startTime = now();
        nsProcess(inBuffer, sampleRate, inSampleCount, channels, kModerate);
        double time_interval = calcElapsed(startTime, now());
        printf("time interval: %d ms\n ", (int) (time_interval * 1000));


        wavWrite_int16(out_file, inBuffer, sampleRate, inSampleCount, channels);
        free(inBuffer);
    }
}